

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O1

int ASN1_STRING_print_ex_fp(FILE *fp,ASN1_STRING *str,ulong flags)

{
  int iVar1;
  BIO *out;
  
  if (fp == (FILE *)0x0) {
    out = (BIO *)0x0;
  }
  else {
    out = BIO_new_fp(fp,0);
    if (out == (BIO *)0x0) {
      return -1;
    }
  }
  iVar1 = ASN1_STRING_print_ex(out,str,flags);
  BIO_free(out);
  return iVar1;
}

Assistant:

int ASN1_STRING_print_ex_fp(FILE *fp, const ASN1_STRING *str,
                            unsigned long flags) {
  BIO *bio = NULL;
  if (fp != NULL) {
    // If |fp| is NULL, this function returns the number of bytes without
    // writing.
    bio = BIO_new_fp(fp, BIO_NOCLOSE);
    if (bio == NULL) {
      return -1;
    }
  }
  int ret = ASN1_STRING_print_ex(bio, str, flags);
  BIO_free(bio);
  return ret;
}